

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

Vec_Int_t * Acb_NtkFindNodes2(Acb_Ntk_t *p)

{
  int i;
  Vec_Int_t *vNodes;
  int *piVar1;
  int i_00;
  
  vNodes = Vec_IntAlloc(1000);
  Acb_NtkIncTravId(p);
  for (i_00 = 0; i_00 < (p->vCos).nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(&p->vCos,i_00);
    piVar1 = Acb_ObjFanins(p,i);
    Acb_NtkFindNodes2_rec(p,piVar1[1],vNodes);
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Acb_NtkFindNodes2( Acb_Ntk_t * p )
{
    int i, iObj;
    Vec_Int_t * vNodes = Vec_IntAlloc( 1000 );
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCo( p, iObj, i )
        Acb_NtkFindNodes2_rec( p, Acb_ObjFanin(p, iObj, 0), vNodes );
    return vNodes;
}